

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.c
# Opt level: O0

int cdns_init_server(event_base *base)

{
  int iVar1;
  sockaddr_in6 *addr6;
  sockaddr_in *addr4;
  sockaddr_storage addr;
  int fd;
  int error;
  event_base *base_local;
  
  addr.__ss_align._0_4_ = -1;
  iVar1 = evutil_inet_pton(10,g_cdns_cfg.local_ip,&addr);
  if (iVar1 == 1) {
    addr4._0_2_ = 10;
    addr4._2_2_ = htons(g_cdns_cfg.local_port);
  }
  else {
    iVar1 = evutil_inet_pton(2,g_cdns_cfg.local_ip,(long)&addr4 + 4);
    if (iVar1 != 1) {
      _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x37c
                 ,"cdns_init_server",1,3,"evutil_inet_pton");
      goto LAB_00107e7d;
    }
    addr4._0_2_ = 2;
    addr4._2_2_ = htons(g_cdns_cfg.local_port);
  }
  addr.__ss_align._0_4_ = socket((uint)(ushort)addr4,2,0x11);
  if ((int)addr.__ss_align == -1) {
    _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x382,
               "cdns_init_server",1,3,"socket");
  }
  else {
    addr.__ss_align._4_4_ = bind((int)addr.__ss_align,(sockaddr *)&addr4,0x80);
    if (addr.__ss_align._4_4_ == 0) {
      addr.__ss_align._4_4_ = evutil_make_socket_nonblocking((int)addr.__ss_align);
      if (addr.__ss_align._4_4_ == 0) {
        listener = (event *)event_new(base,(int)addr.__ss_align,0x12,cdns_pkt_from_client,base);
        if (listener == (event *)0x0) {
          _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                     0x394,"cdns_init_server",1,3,"event_new");
        }
        else {
          addr.__ss_align._4_4_ = event_add(listener,0);
          if (addr.__ss_align._4_4_ == 0) {
            _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c"
                       ,0x39e,"cdns_init_server",0,6,"cdns @ %s:%u",g_cdns_cfg.local_ip,
                       (uint)g_cdns_cfg.local_port);
            start_tester(base);
            return 0;
          }
          _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                     0x39a,"cdns_init_server",1,3,"event_add");
        }
      }
      else {
        _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                   0x38e,"cdns_init_server",1,3,"evutil_make_socket_nonblocking");
      }
    }
    else {
      _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x388
                 ,"cdns_init_server",1,3,"bind");
    }
  }
LAB_00107e7d:
  cdns_fini_server();
  if (((int)addr.__ss_align != -1) && (iVar1 = evutil_closesocket((int)addr.__ss_align), iVar1 != 0)
     ) {
    _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x3a8,
               "cdns_init_server",1,4,"evutil_closesocket");
  }
  return -1;
}

Assistant:

int cdns_init_server(struct event_base * base)
{
    int error;
    int fd = -1;
    struct sockaddr_storage addr;
    struct sockaddr_in * addr4 = (struct sockaddr_in *)&addr;
    struct sockaddr_in6 * addr6 = (struct sockaddr_in6 *)&addr;

    if (evutil_inet_pton(AF_INET6, g_cdns_cfg.local_ip, &addr6->sin6_addr) == 1) {
        addr6->sin6_family = AF_INET6;
        addr6->sin6_port = htons(g_cdns_cfg.local_port);
    }
    else if (evutil_inet_pton(AF_INET, g_cdns_cfg.local_ip, &addr4->sin_addr) == 1) {
        addr4->sin_family = AF_INET;
        addr4->sin_port = htons(g_cdns_cfg.local_port);
    }
    else {
        log_errno(LOG_ERR, "evutil_inet_pton");
        goto fail;
    }

    fd = socket(addr.ss_family, SOCK_DGRAM, IPPROTO_UDP);
    if (fd == -1) {
        log_errno(LOG_ERR, "socket");
        goto fail;
    }

    error = bind(fd, (struct sockaddr*)&addr, sizeof(addr));
    if (error) {
        log_errno(LOG_ERR, "bind");
        goto fail;
    }

    error = evutil_make_socket_nonblocking(fd);
    if (error) {
        log_errno(LOG_ERR, "evutil_make_socket_nonblocking");
        goto fail;
    }

    listener = event_new(base, fd, EV_READ | EV_PERSIST, cdns_pkt_from_client, base);
    if (!listener) {
        log_errno(LOG_ERR, "event_new");
        goto fail;
    }
    error = event_add(listener, NULL);
    if (error)
    {
        log_errno(LOG_ERR, "event_add");
        goto fail;
    }

    log_error(LOG_INFO, "cdns @ %s:%u", g_cdns_cfg.local_ip, g_cdns_cfg.local_port);

    // Start tester to collect information for each server
    start_tester(base);
    return 0;

fail:
    cdns_fini_server();

    if (fd != -1 && evutil_closesocket(fd) != 0)
        log_errno(LOG_WARNING, "evutil_closesocket");

    return -1;
}